

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depfile_parser_test.cc
# Opt level: O0

void __thiscall
DepfileParserTestMultipleDifferentOutputs::~DepfileParserTestMultipleDifferentOutputs
          (DepfileParserTestMultipleDifferentOutputs *this)

{
  DepfileParserTestMultipleDifferentOutputs *this_local;
  
  ~DepfileParserTestMultipleDifferentOutputs(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

TEST_F(DepfileParserTest, MultipleDifferentOutputs) {
  // check that multiple different outputs are accepted by the parser
  string err;
  EXPECT_TRUE(Parse("foo bar: x y z", &err));
  ASSERT_EQ(2u, parser_.outs_.size());
  ASSERT_EQ("foo", parser_.outs_[0].AsString());
  ASSERT_EQ("bar", parser_.outs_[1].AsString());
  ASSERT_EQ(3u, parser_.ins_.size());
  EXPECT_EQ("x", parser_.ins_[0].AsString());
  EXPECT_EQ("y", parser_.ins_[1].AsString());
  EXPECT_EQ("z", parser_.ins_[2].AsString());
}